

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void __thiscall SSTable::fillData(SSTable *this,SSTableData *new_data)

{
  pointer *ppSVar1;
  pointer pSVar2;
  pointer pSVar3;
  longlong lVar4;
  longlong lVar5;
  vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *this_00;
  iterator __position;
  SSTableData *pSVar6;
  SSTableIndex *pSVar7;
  SSTableHeader *pSVar8;
  SSTableDataEntry *item;
  pointer pSVar9;
  size_t sVar10;
  iterator __end1;
  SSTableIndexItem local_40;
  
  pSVar6 = (SSTableData *)operator_new(0x18);
  pSVar2 = (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  (pSVar6->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = pSVar2;
  pSVar3 = (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (pSVar6->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = pSVar3;
  (pSVar6->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->data = pSVar6;
  lVar4 = pSVar2->key;
  lVar5 = pSVar3[-1].key;
  pSVar7 = (SSTableIndex *)operator_new(0x18);
  (pSVar7->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar7->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar7->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->index = pSVar7;
  sVar10 = 0x20;
  if (pSVar2 != pSVar3) {
    pSVar9 = pSVar2;
    do {
      this_00 = this->index;
      local_40.key = pSVar9->key;
      __position._M_current =
           (this_00->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      local_40.offset = sVar10;
      if (__position._M_current ==
          (this_00->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::
        _M_realloc_insert<SSTableIndexItem>(this_00,__position,&local_40);
      }
      else {
        (__position._M_current)->key = local_40.key;
        (__position._M_current)->offset = sVar10;
        ppSVar1 = &(this_00->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      sVar10 = sVar10 + (pSVar9->value)._M_string_length + 0x19;
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 != pSVar3);
  }
  pSVar8 = (SSTableHeader *)operator_new(0x20);
  pSVar8->index_offset = sVar10;
  pSVar8->entries_count = (long)pSVar3 - (long)pSVar2 >> 6;
  pSVar8->key_min = lVar4;
  pSVar8->key_max = lVar5;
  this->header = pSVar8;
  return;
}

Assistant:

void SSTable::fillData(SSTableData &&new_data) {
    data = new SSTableData{std::move(new_data)};
    long long key_min = 0, key_max = 0;
    size_t file_offset = 0, entries_count = data->size();
    // Determining header.
    key_min = data->begin()->key;
    key_max = data->rbegin()->key;
    file_offset = 32; // Header use 32 bytes.
    size_t item_bytes = 0;
    index = new SSTableIndex{};
    for (const auto &item:*data) {
        index->push_back({item.key, file_offset});
        item_bytes = size_of_entry(item);
        file_offset += item_bytes;
    }
    header = new SSTableHeader{file_offset, entries_count, key_min, key_max};
}